

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

TokenOrSyntax * __thiscall
slang::syntax::RangeSelectSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,RangeSelectSyntax *this,size_t index)

{
  Info *pIVar1;
  ExpressionSyntax *pEVar2;
  
  if (index == 2) {
    pEVar2 = (this->right).ptr;
  }
  else {
    if (index == 1) {
      pIVar1 = (this->range).info;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ConstTokenOrSyntax).
        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
           *(undefined8 *)&this->range;
      *(Info **)((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
                        super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                        .
                        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                + 8) = pIVar1;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
               super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
       0x10) = '\0';
      return __return_storage_ptr__;
    }
    if (index != 0) {
      TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
      return __return_storage_ptr__;
    }
    pEVar2 = (this->left).ptr;
  }
  *(ExpressionSyntax **)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pEVar2;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\x01';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax RangeSelectSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return left.get();
        case 1: return range;
        case 2: return right.get();
        default: return nullptr;
    }
}